

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *this,
          TypedID<(spirv_cross::Types)0> (*init) [4])

{
  long lVar1;
  size_t i;
  long lVar2;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> **)this = this + 0x18;
  *(undefined8 *)(this + 0x10) = 8;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::reserve
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)this,4);
  lVar1 = *(long *)this;
  lVar2 = 0;
  do {
    *(uint32_t *)(lVar1 + lVar2 * 4) = (*init)[lVar2].id;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  *(undefined8 *)(this + 8) = 4;
  return;
}

Assistant:

explicit SmallVector(const U (&init)[M]) SPIRV_CROSS_NOEXCEPT : SmallVector(init, init + M)
	{
	}